

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IndexCloseReader(Fts5Index *p)

{
  int iVar1;
  long in_RDI;
  sqlite3_blob *pReader;
  int rc;
  
  if (*(long *)(in_RDI + 0x48) != 0) {
    *(undefined8 *)(in_RDI + 0x48) = 0;
    iVar1 = sqlite3_blob_close(pReader);
    if (*(int *)(in_RDI + 0x3c) == 0) {
      *(int *)(in_RDI + 0x3c) = iVar1;
    }
  }
  return;
}

Assistant:

static void fts5IndexCloseReader(Fts5Index *p){
  if( p->pReader ){
    int rc;
    sqlite3_blob *pReader = p->pReader;
    p->pReader = 0;
    rc = sqlite3_blob_close(pReader);
    if( p->rc==SQLITE_OK ) p->rc = rc;
  }
}